

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

void portfwdmgr_config(PortFwdManager *mgr,Conf *conf)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  tree234 *ptVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  PortFwdRecord *pPVar9;
  char *pcVar10;
  ssh_rportfwd *psVar11;
  char *pcVar12;
  char *local_1a8;
  char *local_188;
  char *local_178;
  char *local_150;
  char *local_140;
  char *local_130;
  char *local_118;
  char *local_110;
  char *local_100;
  int local_f4;
  char *local_f0;
  char *local_e8;
  char *local_d8;
  char *shost;
  char *err_1;
  char *err;
  char *dportdesc;
  char *sportdesc;
  char *msg2;
  char *message;
  PortFwdRecord *existing;
  char *saddr_tmp;
  char *host;
  char *saddr;
  char *dports;
  char *sports;
  int dserv;
  int sserv;
  int dport;
  int sport;
  char type;
  char address_family;
  char *vp2;
  char *vp;
  char *kp2;
  char *kp;
  char *val;
  char *key;
  PortFwdRecord *pPStack_20;
  int i;
  PortFwdRecord *pfr;
  Conf *conf_local;
  PortFwdManager *mgr_local;
  
  pfr = (PortFwdRecord *)conf;
  conf_local = (Conf *)mgr;
  if (mgr->conf != (Conf *)0x0) {
    conf_free(mgr->conf);
  }
  ptVar5 = (tree234 *)conf_copy((Conf *)pfr);
  conf_local[1].tree = ptVar5;
  key._4_4_ = 0;
  while (pPStack_20 = (PortFwdRecord *)index234(conf_local[2].tree,key._4_4_),
        pPStack_20 != (PortFwdRecord *)0x0) {
    pPStack_20->status = DESTROY;
    key._4_4_ = key._4_4_ + 1;
  }
  kp = conf_get_str_strs((Conf *)pfr,0xb0,(char *)0x0,&val);
  while (kp != (char *)0x0) {
    kp2 = val;
    dport._3_1_ = 'A';
    dport._2_1_ = 'L';
    if (((*val == 'A') || (*val == '4')) || (*val == '6')) {
      kp2 = val + 1;
      dport._3_1_ = *val;
    }
    if ((*kp2 == 'L') || (*kp2 == 'R')) {
      dport._2_1_ = *kp2;
      kp2 = kp2 + 1;
    }
    pcVar6 = host_strchr(kp2,0x3a);
    if (pcVar6 == (char *)0x0) {
      host = (char *)0x0;
      dports = kp2;
    }
    else {
      pcVar7 = dupprintf("%.*s",(ulong)(uint)((int)pcVar6 - (int)kp2),kp2);
      host = host_strduptrim(pcVar7);
      safefree(pcVar7);
      dports = pcVar6 + 1;
    }
    sserv = atoi(dports);
    bVar1 = false;
    if (sserv == 0) {
      bVar1 = true;
      sserv = net_service_lookup(dports);
      if (sserv == 0) {
        logeventf((LogContext *)conf_local->tree->root,
                  "Service lookup failed for source port \"%s\"",dports);
      }
    }
    if ((dport._2_1_ == 'L') && (iVar4 = strcmp(kp,"D"), iVar4 == 0)) {
      saddr_tmp = (char *)0x0;
      saddr = (char *)0x0;
      dserv = -1;
      bVar2 = false;
      dport._2_1_ = 'D';
    }
    else {
      sVar8 = host_strcspn(kp,":");
      _sport = kp + sVar8;
      saddr_tmp = dupprintf("%.*s",(ulong)(uint)((int)_sport - (int)kp),kp);
      if (*_sport != '\0') {
        _sport = _sport + 1;
      }
      saddr = _sport;
      dserv = atoi(_sport);
      bVar2 = false;
      if (dserv == 0) {
        bVar2 = true;
        dserv = net_service_lookup(_sport);
        if (dserv == 0) {
          logeventf((LogContext *)conf_local->tree->root,
                    "Service lookup failed for destination port \"%s\"",_sport);
        }
      }
    }
    if ((sserv == 0) || (dserv == 0)) {
      safefree(host);
      safefree(saddr_tmp);
    }
    else {
      pPStack_20 = (PortFwdRecord *)safemalloc(1,0x48,0);
      pPStack_20->type = (int)dport._2_1_;
      pPStack_20->saddr = host;
      if (bVar1) {
        local_e8 = dupstr(dports);
      }
      else {
        local_e8 = (char *)0x0;
      }
      pPStack_20->sserv = local_e8;
      pPStack_20->sport = sserv;
      pPStack_20->daddr = saddr_tmp;
      if (bVar2) {
        local_f0 = dupstr(saddr);
      }
      else {
        local_f0 = (char *)0x0;
      }
      pPStack_20->dserv = local_f0;
      pPStack_20->dport = dserv;
      pPStack_20->local = (PortListener *)0x0;
      pPStack_20->remote = (ssh_rportfwd *)0x0;
      if (dport._3_1_ == '4') {
        local_f4 = 1;
      }
      else {
        local_f4 = 0;
        if (dport._3_1_ == '6') {
          local_f4 = 2;
        }
      }
      pPStack_20->addressfamily = local_f4;
      pPVar9 = (PortFwdRecord *)add234(conf_local[2].tree,pPStack_20);
      if (pPVar9 == pPStack_20) {
        pPStack_20->status = CREATE;
      }
      else {
        if (pPVar9->status == DESTROY) {
          pPVar9->status = KEEP;
        }
        pfr_free(pPStack_20);
      }
    }
    kp = conf_get_str_strs((Conf *)pfr,0xb0,val,&val);
  }
  key._4_4_ = 0;
  while (pPStack_20 = (PortFwdRecord *)index234(conf_local[2].tree,key._4_4_),
        pPStack_20 != (PortFwdRecord *)0x0) {
    if (pPStack_20->status == DESTROY) {
      if (pPStack_20->type == 0x4c) {
        local_100 = "local";
      }
      else {
        local_100 = "dynamic";
        if (pPStack_20->type == 0x52) {
          local_100 = "remote";
        }
      }
      if (pPStack_20->saddr == (char *)0x0) {
        local_110 = "";
      }
      else {
        local_110 = pPStack_20->saddr;
      }
      pcVar6 = "";
      if (pPStack_20->saddr != (char *)0x0) {
        pcVar6 = ":";
      }
      pcVar6 = dupprintf("%s port forwarding from %s%s%d",local_100,local_110,pcVar6,
                         (ulong)pPStack_20->sport);
      msg2 = pcVar6;
      if (pPStack_20->type != 0x44) {
        msg2 = dupprintf("%s to %s:%d",pcVar6,pPStack_20->daddr,(ulong)pPStack_20->dport);
        safefree(pcVar6);
      }
      logeventf((LogContext *)conf_local->tree->root,"Cancelling %s",msg2);
      safefree(msg2);
      if (pPStack_20->remote == (ssh_rportfwd *)0x0) {
        if (pPStack_20->local != (PortListener *)0x0) {
          pfl_terminate(pPStack_20->local);
          pPStack_20->local = (PortListener *)0x0;
        }
      }
      else {
        ssh_rportfwd_remove((ConnectionLayer *)conf_local->tree,pPStack_20->remote);
        pPStack_20->remote = (ssh_rportfwd *)0x0;
      }
      delpos234(conf_local[2].tree,key._4_4_);
      pfr_free(pPStack_20);
      key._4_4_ = key._4_4_ + -1;
    }
    key._4_4_ = key._4_4_ + 1;
  }
  key._4_4_ = 0;
  pPStack_20 = (PortFwdRecord *)0x0;
  while (pPStack_20 = (PortFwdRecord *)index234(conf_local[2].tree,key._4_4_),
        pPStack_20 != (PortFwdRecord *)0x0) {
    if (pPStack_20->status == CREATE) {
      if (pPStack_20->saddr == (char *)0x0) {
        local_118 = "";
      }
      else {
        local_118 = pPStack_20->saddr;
      }
      pcVar6 = "";
      if (pPStack_20->saddr != (char *)0x0) {
        pcVar6 = ":";
      }
      if (pPStack_20->sserv == (char *)0x0) {
        local_130 = "";
      }
      else {
        local_130 = pPStack_20->sserv;
      }
      pcVar7 = "";
      if (pPStack_20->sserv != (char *)0x0) {
        pcVar7 = "(";
      }
      pcVar10 = "";
      if (pPStack_20->sserv != (char *)0x0) {
        pcVar10 = ")";
      }
      pcVar6 = dupprintf("%s%s%s%s%d%s",local_118,pcVar6,local_130,pcVar7,(ulong)pPStack_20->sport,
                         pcVar10);
      if (pPStack_20->type == 0x44) {
        err = (char *)0x0;
      }
      else {
        if (pPStack_20->dserv == (char *)0x0) {
          local_140 = "";
        }
        else {
          local_140 = pPStack_20->dserv;
        }
        pcVar7 = "";
        if (pPStack_20->dserv != (char *)0x0) {
          pcVar7 = "(";
        }
        pcVar12 = "";
        if (pPStack_20->dserv != (char *)0x0) {
          pcVar12 = ")";
        }
        err = dupprintf("%s:%s%s%d%s",pPStack_20->daddr,local_140,pcVar7,(ulong)pPStack_20->dport,
                        pcVar12,pcVar10);
      }
      if (pPStack_20->type == 0x4c) {
        pcVar7 = pfl_listen(pPStack_20->daddr,pPStack_20->dport,pPStack_20->saddr,pPStack_20->sport,
                            (ConnectionLayer *)conf_local->tree,(Conf *)pfr,&pPStack_20->local,
                            pPStack_20->addressfamily);
        if (pPStack_20->addressfamily == 1) {
          local_150 = "IPv4 ";
        }
        else {
          local_150 = "";
          if (pPStack_20->addressfamily == 2) {
            local_150 = "IPv6 ";
          }
        }
        pcVar10 = "";
        if (pcVar7 == (char *)0x0) {
          local_178 = "";
        }
        else {
          pcVar10 = " failed: ";
          local_178 = pcVar7;
        }
        logeventf((LogContext *)conf_local->tree->root,"Local %sport %s forwarding to %s%s%s",
                  local_150,pcVar6,err,pcVar10,local_178);
        if (pcVar7 != (char *)0x0) {
          safefree(pcVar7);
        }
      }
      else if (pPStack_20->type == 0x44) {
        pcVar7 = pfl_listen((char *)0x0,-1,pPStack_20->saddr,pPStack_20->sport,
                            (ConnectionLayer *)conf_local->tree,(Conf *)pfr,&pPStack_20->local,
                            pPStack_20->addressfamily);
        if (pPStack_20->addressfamily == 1) {
          local_188 = "IPv4 ";
        }
        else {
          local_188 = "";
          if (pPStack_20->addressfamily == 2) {
            local_188 = "IPv6 ";
          }
        }
        pcVar10 = "";
        if (pcVar7 == (char *)0x0) {
          local_1a8 = "";
        }
        else {
          pcVar10 = " failed: ";
          local_1a8 = pcVar7;
        }
        logeventf((LogContext *)conf_local->tree->root,
                  "Local %sport %s SOCKS dynamic forwarding%s%s",local_188,pcVar6,pcVar10,local_1a8)
        ;
        if (pcVar7 != (char *)0x0) {
          safefree(pcVar7);
        }
      }
      else {
        if (pPStack_20->saddr == (char *)0x0) {
          _Var3 = conf_get_bool((Conf *)pfr,0xaf);
          if (_Var3) {
            local_d8 = "";
          }
          else {
            local_d8 = "localhost";
          }
        }
        else {
          local_d8 = pPStack_20->saddr;
        }
        psVar11 = ssh_rportfwd_alloc((ConnectionLayer *)conf_local->tree,local_d8,pPStack_20->sport,
                                     pPStack_20->daddr,pPStack_20->dport,pPStack_20->addressfamily,
                                     pcVar6,pPStack_20,(ssh_sharing_connstate *)0x0);
        pPStack_20->remote = psVar11;
        if (pPStack_20->remote == (ssh_rportfwd *)0x0) {
          logeventf((LogContext *)conf_local->tree->root,"Duplicate remote port forwarding to %s:%d"
                    ,pPStack_20->daddr,(ulong)pPStack_20->dport);
          pfr_free(pPStack_20);
        }
        else {
          logeventf((LogContext *)conf_local->tree->root,"Requesting remote port %s forward to %s",
                    pcVar6,err);
        }
      }
      safefree(pcVar6);
      safefree(err);
    }
    key._4_4_ = key._4_4_ + 1;
  }
  return;
}

Assistant:

void portfwdmgr_config(PortFwdManager *mgr, Conf *conf)
{
    PortFwdRecord *pfr;
    int i;
    char *key, *val;

    if (mgr->conf)
        conf_free(mgr->conf);
    mgr->conf = conf_copy(conf);

    /*
     * Go through the existing port forwardings and tag them
     * with status==DESTROY. Any that we want to keep will be
     * re-enabled (status==KEEP) as we go through the
     * configuration and find out which bits are the same as
     * they were before.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++)
        pfr->status = DESTROY;

    for (val = conf_get_str_strs(conf, CONF_portfwd, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, CONF_portfwd, key, &key)) {
        char *kp, *kp2, *vp, *vp2;
        char address_family, type;
        int sport, dport, sserv, dserv;
        char *sports, *dports, *saddr, *host;

        kp = key;

        address_family = 'A';
        type = 'L';
        if (*kp == 'A' || *kp == '4' || *kp == '6')
            address_family = *kp++;
        if (*kp == 'L' || *kp == 'R')
            type = *kp++;

        if ((kp2 = host_strchr(kp, ':')) != NULL) {
            /*
             * There's a colon in the middle of the source port
             * string, which means that the part before it is
             * actually a source address.
             */
            char *saddr_tmp = dupprintf("%.*s", (int)(kp2 - kp), kp);
            saddr = host_strduptrim(saddr_tmp);
            sfree(saddr_tmp);
            sports = kp2+1;
        } else {
            saddr = NULL;
            sports = kp;
        }
        sport = atoi(sports);
        sserv = 0;
        if (sport == 0) {
            sserv = 1;
            sport = net_service_lookup(sports);
            if (!sport) {
                logeventf(mgr->cl->logctx, "Service lookup failed for source"
                          " port \"%s\"", sports);
            }
        }

        if (type == 'L' && !strcmp(val, "D")) {
            /* dynamic forwarding */
            host = NULL;
            dports = NULL;
            dport = -1;
            dserv = 0;
            type = 'D';
        } else {
            /* ordinary forwarding */
            vp = val;
            vp2 = vp + host_strcspn(vp, ":");
            host = dupprintf("%.*s", (int)(vp2 - vp), vp);
            if (*vp2)
                vp2++;
            dports = vp2;
            dport = atoi(dports);
            dserv = 0;
            if (dport == 0) {
                dserv = 1;
                dport = net_service_lookup(dports);
                if (!dport) {
                    logeventf(mgr->cl->logctx,
                              "Service lookup failed for destination"
                              " port \"%s\"", dports);
                }
            }
        }

        if (sport && dport) {
            /* Set up a description of the source port. */
            pfr = snew(PortFwdRecord);
            pfr->type = type;
            pfr->saddr = saddr;
            pfr->sserv = sserv ? dupstr(sports) : NULL;
            pfr->sport = sport;
            pfr->daddr = host;
            pfr->dserv = dserv ? dupstr(dports) : NULL;
            pfr->dport = dport;
            pfr->local = NULL;
            pfr->remote = NULL;
            pfr->addressfamily = (address_family == '4' ? ADDRTYPE_IPV4 :
                                  address_family == '6' ? ADDRTYPE_IPV6 :
                                  ADDRTYPE_UNSPEC);

            PortFwdRecord *existing = add234(mgr->forwardings, pfr);
            if (existing != pfr) {
                if (existing->status == DESTROY) {
                    /*
                     * We already have a port forwarding up and running
                     * with precisely these parameters. Hence, no need
                     * to do anything; simply re-tag the existing one
                     * as KEEP.
                     */
                    existing->status = KEEP;
                }
                /*
                 * Anything else indicates that there was a duplicate
                 * in our input, which we'll silently ignore.
                 */
                pfr_free(pfr);
            } else {
                pfr->status = CREATE;
            }
        } else {
            sfree(saddr);
            sfree(host);
        }
    }

    /*
     * Now go through and destroy any port forwardings which were
     * not re-enabled.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == DESTROY) {
            char *message;

            message = dupprintf("%s port forwarding from %s%s%d",
                                pfr->type == 'L' ? "local" :
                                pfr->type == 'R' ? "remote" : "dynamic",
                                pfr->saddr ? pfr->saddr : "",
                                pfr->saddr ? ":" : "",
                                pfr->sport);

            if (pfr->type != 'D') {
                char *msg2 = dupprintf("%s to %s:%d", message,
                                       pfr->daddr, pfr->dport);
                sfree(message);
                message = msg2;
            }

            logeventf(mgr->cl->logctx, "Cancelling %s", message);
            sfree(message);

            /* pfr->remote or pfr->local may be NULL if setting up a
             * forwarding failed. */
            if (pfr->remote) {
                /*
                 * Cancel the port forwarding at the server
                 * end.
                 *
                 * Actually closing the listening port on the server
                 * side may fail - because in SSH-1 there's no message
                 * in the protocol to request it!
                 *
                 * Instead, we simply remove the record of the
                 * forwarding from our local end, so that any
                 * connections the server tries to make on it are
                 * rejected.
                 */
                ssh_rportfwd_remove(mgr->cl, pfr->remote);
                pfr->remote = NULL;
            } else if (pfr->local) {
                pfl_terminate(pfr->local);
                pfr->local = NULL;
            }

            delpos234(mgr->forwardings, i);
            pfr_free(pfr);
            i--;                       /* so we don't skip one in the list */
        }
    }

    /*
     * And finally, set up any new port forwardings (status==CREATE).
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == CREATE) {
            char *sportdesc, *dportdesc;
            sportdesc = dupprintf("%s%s%s%s%d%s",
                                  pfr->saddr ? pfr->saddr : "",
                                  pfr->saddr ? ":" : "",
                                  pfr->sserv ? pfr->sserv : "",
                                  pfr->sserv ? "(" : "",
                                  pfr->sport,
                                  pfr->sserv ? ")" : "");
            if (pfr->type == 'D') {
                dportdesc = NULL;
            } else {
                dportdesc = dupprintf("%s:%s%s%d%s",
                                      pfr->daddr,
                                      pfr->dserv ? pfr->dserv : "",
                                      pfr->dserv ? "(" : "",
                                      pfr->dport,
                                      pfr->dserv ? ")" : "");
            }

            if (pfr->type == 'L') {
                char *err = pfl_listen(pfr->daddr, pfr->dport,
                                       pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s forwarding to %s%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc, dportdesc,
                          err ? " failed: " : "", err ? err : "");
                if (err)
                    sfree(err);
            } else if (pfr->type == 'D') {
                char *err = pfl_listen(NULL, -1, pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s SOCKS dynamic forwarding%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc,
                          err ? " failed: " : "", err ? err : "");

                if (err)
                    sfree(err);
            } else {
                const char *shost;

                if (pfr->saddr) {
                    shost = pfr->saddr;
                } else if (conf_get_bool(conf, CONF_rport_acceptall)) {
                    shost = "";
                } else {
                    shost = "localhost";
                }

                pfr->remote = ssh_rportfwd_alloc(
                    mgr->cl, shost, pfr->sport, pfr->daddr, pfr->dport,
                    pfr->addressfamily, sportdesc, pfr, NULL);

                if (!pfr->remote) {
                    logeventf(mgr->cl->logctx,
                              "Duplicate remote port forwarding to %s:%d",
                              pfr->daddr, pfr->dport);
                    pfr_free(pfr);
                } else {
                    logeventf(mgr->cl->logctx, "Requesting remote port %s"
                              " forward to %s", sportdesc, dportdesc);
                }
            }
            sfree(sportdesc);
            sfree(dportdesc);
        }
    }
}